

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_usage(Formatter *this,App *app,string *name)

{
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  __first;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  v;
  size_t sVar4;
  App *in_RCX;
  App *in_RDX;
  char *pcVar5;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  string usage;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_fffffffffffffad8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffae8;
  char *in_stack_fffffffffffffaf0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffaf8;
  allocator *paVar6;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  in_stack_fffffffffffffb00;
  undefined7 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0f;
  undefined1 uVar7;
  App *in_stack_fffffffffffffb48;
  App *in_stack_fffffffffffffb58;
  function<bool_(const_CLI::App_*)> *in_stack_fffffffffffffbc0;
  allocator local_411;
  string local_410 [32];
  string local_3f0 [103];
  allocator local_389;
  string local_388 [8];
  function<bool_(const_CLI::Option_*)> *in_stack_fffffffffffffc80;
  App *in_stack_fffffffffffffc88;
  string local_368 [24];
  string *in_stack_fffffffffffffcb0;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2d8;
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [127];
  undefined1 local_219 [33];
  string local_1f8 [32];
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  undefined4 local_50;
  string local_40 [40];
  App *local_18;
  
  local_18 = in_RDX;
  App::get_usage_abi_cxx11_(in_stack_fffffffffffffb48);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
                     (char *)in_stack_fffffffffffffb00._M_current);
    local_50 = 1;
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1d8);
    ::std::operator<<(local_1c8,'\n');
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ::std::operator<<(local_1c8,(string *)in_RCX);
    }
    else {
      in_stack_fffffffffffffbc0 = (function<bool_(const_CLI::App_*)> *)local_219;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_219 + 1),"Usage",(allocator *)in_stack_fffffffffffffbc0);
      FormatterBase::get_label
                ((FormatterBase *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
                 (string *)in_stack_fffffffffffffb00._M_current);
      poVar3 = ::std::operator<<(local_1c8,local_1f8);
      ::std::operator<<(poVar3,':');
      ::std::__cxx11::string::~string(local_1f8);
      ::std::__cxx11::string::~string((string *)(local_219 + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)local_219);
    }
    App::get_groups_abi_cxx11_(in_stack_fffffffffffffb58);
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_1_,void>
              ((function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffae8);
    App::get_options(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::function<bool_(const_CLI::Option_*)>::~function
              ((function<bool_(const_CLI::Option_*)> *)0x12d617);
    bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                      ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                       in_stack_fffffffffffffaf0);
    if (!bVar1) {
      poVar3 = ::std::operator<<(local_1c8," [");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b8,"options",&local_2b9);
      FormatterBase::get_label
                ((FormatterBase *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
                 (string *)in_stack_fffffffffffffb00._M_current);
      poVar3 = ::std::operator<<(poVar3,local_298);
      ::std::operator<<(poVar3,"]");
      ::std::__cxx11::string::~string(local_298);
      ::std::__cxx11::string::~string(local_2b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    }
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_2_,void>
              ((function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffae8);
    App::get_options(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::function<bool_(const_CLI::Option_*)>::~function
              ((function<bool_(const_CLI::Option_*)> *)0x12d801);
    bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                      ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                       in_stack_fffffffffffffaf0);
    if (!bVar1) {
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::size(&local_2d8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x12d840);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb00._M_current,
               (size_type)in_stack_fffffffffffffaf8._M_current,
               (allocator_type *)in_stack_fffffffffffffaf0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x12d86c);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                (in_stack_fffffffffffffad8);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                (in_stack_fffffffffffffad8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffad8);
      __first._M_current._7_1_ = in_stack_fffffffffffffb0f;
      __first._M_current._0_7_ = in_stack_fffffffffffffb08;
      v = ::std::
          transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
                    (__first,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                     (anon_class_8_1_8991fb9c)in_stack_fffffffffffffaf0);
      poVar3 = ::std::operator<<(local_1c8," ");
      paVar6 = &local_389;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_388," ",paVar6);
      detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)v._M_current,in_stack_fffffffffffffcb0);
      ::std::operator<<(poVar3,local_368);
      ::std::__cxx11::string::~string(local_368);
      ::std::__cxx11::string::~string(local_388);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffaf0);
    }
    ::std::function<bool(CLI::App_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::App_const*)_1_,void>
              ((function<bool_(const_CLI::App_*)> *)in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffae8);
    App::get_subcommands(in_RCX,in_stack_fffffffffffffbc0);
    bVar1 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::empty
                      ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                       in_stack_fffffffffffffaf0);
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
               in_stack_fffffffffffffaf0);
    std::function<bool_(const_CLI::App_*)>::~function((function<bool_(const_CLI::App_*)> *)0x12db01)
    ;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar3 = ::std::operator<<(local_1c8,' ');
      sVar4 = App::get_require_subcommand_min(local_18);
      pcVar5 = "";
      if (sVar4 == 0) {
        pcVar5 = "[";
      }
      poVar3 = ::std::operator<<(poVar3,pcVar5);
      sVar4 = App::get_require_subcommand_max(local_18);
      uVar7 = true;
      if (1 < sVar4) {
        in_stack_fffffffffffffb00._M_current = (Option **)App::get_require_subcommand_min(local_18);
        uVar7 = (string *)0x1 < in_stack_fffffffffffffb00._M_current;
      }
      in_stack_fffffffffffffaf0 = "SUBCOMMANDS";
      if ((bool)uVar7 != false) {
        in_stack_fffffffffffffaf0 = "SUBCOMMAND";
      }
      paVar6 = &local_411;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_410,in_stack_fffffffffffffaf0,paVar6);
      FormatterBase::get_label
                ((FormatterBase *)CONCAT17(uVar7,in_stack_fffffffffffffb08),
                 (string *)in_stack_fffffffffffffb00._M_current);
      poVar3 = ::std::operator<<(poVar3,local_3f0);
      sVar4 = App::get_require_subcommand_min(local_18);
      pcVar5 = "";
      if (sVar4 == 0) {
        pcVar5 = "]";
      }
      ::std::operator<<(poVar3,pcVar5);
      ::std::__cxx11::string::~string(local_3f0);
      ::std::__cxx11::string::~string(local_410);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_411);
    }
    ::std::operator<<(local_1c8,"\n");
    ::std::__cxx11::stringstream::str();
    local_50 = 1;
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
               in_stack_fffffffffffffaf0);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
               in_stack_fffffffffffffaf0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffaf0);
    ::std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  ::std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_usage(const App *app, std::string name) const {
    std::string usage = app->get_usage();
    if(!usage.empty()) {
        // return usage + "\n\n";
        return usage + "\n";
    }

    std::stringstream out;
    out << '\n';

    if(name.empty())
        out << get_label("Usage") << ':';
    else
        out << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("options") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << ' ' << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    // out << "\n\n";
    out << "\n";

    return out.str();
}